

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

bool __thiscall
OSSLRSA::reconstructParameters
          (OSSLRSA *this,AsymmetricParameters **ppParams,ByteString *serialisedData)

{
  size_t sVar1;
  long *plVar2;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  RSAParameters *params;
  RSAParameters *in_stack_ffffffffffffffd0;
  
  if ((in_RSI != (undefined8 *)0x0) &&
     (sVar1 = ByteString::size((ByteString *)0x1c21d5), sVar1 != 0)) {
    plVar2 = (long *)operator_new(0x38);
    RSAParameters::RSAParameters(in_stack_ffffffffffffffd0);
    uVar3 = (**(code **)(*plVar2 + 0x20))(plVar2,in_RDX);
    if ((uVar3 & 1) == 0) {
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x10))();
      }
      return false;
    }
    *in_RSI = plVar2;
    return true;
  }
  return false;
}

Assistant:

bool OSSLRSA::reconstructParameters(AsymmetricParameters** ppParams, ByteString& serialisedData)
{
	// Check input parameters
	if ((ppParams == NULL) || (serialisedData.size() == 0))
	{
		return false;
	}

	RSAParameters* params = new RSAParameters();

	if (!params->deserialise(serialisedData))
	{
		delete params;

		return false;
	}

	*ppParams = params;

	return true;
}